

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KillReceiver.cpp
# Opt level: O1

void __thiscall KillReceiver::KillReceiver(KillReceiver *this)

{
  int iVar1;
  sigset_t mask;
  string local_b8;
  sigset_t local_98;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"KillReceiver","");
  Subscriber::Subscriber(&this->super_Subscriber,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_00139cb0;
  sigemptyset(&local_98);
  sigaddset(&local_98,2);
  iVar1 = sigprocmask(0,&local_98,(sigset_t *)0x0);
  no_err(iVar1,"sigprocmask failed");
  iVar1 = signalfd(-1,&local_98,0);
  Subscriber::set_fd(&this->super_Subscriber,iVar1);
  Subscriber::set_expected(&this->super_Subscriber,0x19);
  return;
}

Assistant:

KillReceiver::KillReceiver() : Subscriber("KillReceiver") {
    sigset_t mask;
    sigemptyset (&mask);
    sigaddset (&mask, SIGINT);
    no_err(sigprocmask(SIG_BLOCK, &mask, NULL), "sigprocmask failed");
    int fd = signalfd(-1, &mask, 0);
    set_fd(fd);
    set_expected(POLLIN | POLLERR | POLLHUP);
}